

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionDoesNotRefreshOnLogon::RunImpl
          (TestsessionFixtureSessionDoesNotRefreshOnLogon *this)

{
  TestDetails *details;
  sessionFixtureSessionDoesNotRefreshOnLogonHelper fixtureHelper;
  sessionFixtureSessionDoesNotRefreshOnLogonHelper local_660;
  
  details = &(this->super_Test).m_details;
  sessionFixtureSessionDoesNotRefreshOnLogonHelper::sessionFixtureSessionDoesNotRefreshOnLogonHelper
            (&local_660,details);
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionDoesNotRefreshOnLogonHelper>
            (&local_660,details);
  sessionFixture::~sessionFixture(&local_660.super_sessionFixture);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionDoesNotRefreshOnLogon) {
  createSession(1);
  object->setRefreshOnLogon(false);
  CHECK(!object->getRefreshOnLogon());
}